

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictVectorizer.pb.cc
# Opt level: O3

size_t __thiscall CoreML::Specification::DictVectorizer::ByteSizeLong(DictVectorizer *this)

{
  int iVar1;
  size_t sVar2;
  uint uVar3;
  
  if (this->_oneof_case_[0] == 2) {
    sVar2 = Int64Vector::ByteSizeLong((this->Map_).int64toindex_);
  }
  else {
    if (this->_oneof_case_[0] != 1) {
      sVar2 = 0;
      goto LAB_005089a0;
    }
    sVar2 = StringVector::ByteSizeLong((this->Map_).stringtoindex_);
  }
  uVar3 = (uint)sVar2 | 1;
  iVar1 = 0x1f;
  if (uVar3 != 0) {
    for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
    }
  }
  sVar2 = sVar2 + (iVar1 * 9 + 0x49U >> 6) + 1;
LAB_005089a0:
  this->_cached_size_ = (int)sVar2;
  return sVar2;
}

Assistant:

size_t DictVectorizer::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.DictVectorizer)
  size_t total_size = 0;

  switch (Map_case()) {
    // .CoreML.Specification.StringVector stringToIndex = 1;
    case kStringToIndex: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Map_.stringtoindex_);
      break;
    }
    // .CoreML.Specification.Int64Vector int64ToIndex = 2;
    case kInt64ToIndex: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Map_.int64toindex_);
      break;
    }
    case MAP_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}